

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreUtil.cpp
# Opt level: O2

VkImageCreateInfo *
vkt::image::makeImageCreateInfo
          (VkImageCreateInfo *__return_storage_ptr__,Texture *texture,VkFormat format,
          VkImageUsageFlags usage,VkImageCreateFlags flags)

{
  VkSampleCountFlagBits VVar1;
  ImageType imageType;
  VkImageType VVar2;
  Vector<int,_3> local_38;
  
  VVar1 = texture->m_numSamples;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  imageType = texture->m_type;
  __return_storage_ptr__->flags = (uint)(imageType - IMAGE_TYPE_CUBE < 2) << 4 | flags;
  VVar2 = mapImageType(imageType);
  __return_storage_ptr__->imageType = VVar2;
  __return_storage_ptr__->format = format;
  tcu::Vector<int,_3>::Vector(&local_38,&texture->m_layerSize);
  (__return_storage_ptr__->extent).width = local_38.m_data[0];
  (__return_storage_ptr__->extent).height = local_38.m_data[1];
  (__return_storage_ptr__->extent).depth = local_38.m_data[2];
  __return_storage_ptr__->mipLevels = 1;
  __return_storage_ptr__->arrayLayers = texture->m_numLayers;
  __return_storage_ptr__->samples = VVar1;
  __return_storage_ptr__->tiling = VK_IMAGE_TILING_OPTIMAL;
  __return_storage_ptr__->usage = usage;
  __return_storage_ptr__->sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  __return_storage_ptr__->queueFamilyIndexCount = 0;
  __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)0x0;
  __return_storage_ptr__->initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  return __return_storage_ptr__;
}

Assistant:

VkImageCreateInfo makeImageCreateInfo (const Texture& texture, const VkFormat format, const VkImageUsageFlags usage, const VkImageCreateFlags flags)
{
	const VkSampleCountFlagBits samples = static_cast<VkSampleCountFlagBits>(texture.numSamples());	// integer and bit mask are aligned, so we can cast like this

	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,														// VkStructureType			sType;
		DE_NULL,																					// const void*				pNext;
		(isCube(texture) ? (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0u) | flags,	// VkImageCreateFlags		flags;
		mapImageType(texture.type()),																// VkImageType				imageType;
		format,																						// VkFormat					format;
		makeExtent3D(texture.layerSize()),															// VkExtent3D				extent;
		1u,																							// deUint32					mipLevels;
		(deUint32)texture.numLayers(),																// deUint32					arrayLayers;
		samples,																					// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,																	// VkImageTiling			tiling;
		usage,																						// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,																	// VkSharingMode			sharingMode;
		0u,																							// deUint32					queueFamilyIndexCount;
		DE_NULL,																					// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,																	// VkImageLayout			initialLayout;
	};
	return imageParams;
}